

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

int Fraig_NodeIsMuxType(Fraig_Node_t *pNode)

{
  int iVar1;
  Fraig_Node_t *p;
  int *piVar2;
  int *piVar3;
  bool local_29;
  Fraig_Node_t *pNode2;
  Fraig_Node_t *pNode1;
  Fraig_Node_t *pNode_local;
  
  p = (Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe);
  iVar1 = Fraig_NodeIsAnd(p);
  if (iVar1 == 0) {
    pNode_local._4_4_ = 0;
  }
  else {
    iVar1 = Fraig_NodeIsAnd(p->p1);
    if ((iVar1 == 0) || (((ulong)p->p1 & 1) == 0)) {
      pNode_local._4_4_ = 0;
    }
    else {
      iVar1 = Fraig_NodeIsAnd(p->p2);
      if ((iVar1 == 0) || (((ulong)p->p2 & 1) == 0)) {
        pNode_local._4_4_ = 0;
      }
      else {
        piVar2 = (int *)((ulong)p->p1 & 0xfffffffffffffffe);
        piVar3 = (int *)((ulong)p->p2 & 0xfffffffffffffffe);
        if (*piVar3 <= *piVar2) {
          __assert_fail("pNode1->Num < pNode2->Num",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigUtil.c"
                        ,0x260,"int Fraig_NodeIsMuxType(Fraig_Node_t *)");
        }
        if ((*(ulong *)(piVar2 + 8) == (*(ulong *)(piVar3 + 8) ^ 1)) &&
           (*(ulong *)(piVar2 + 10) == (*(ulong *)(piVar3 + 10) ^ 1))) {
          pNode_local._4_4_ = 1;
        }
        else {
          local_29 = true;
          if ((*(ulong *)(piVar2 + 8) != (*(ulong *)(piVar3 + 8) ^ 1)) &&
             ((local_29 = true, *(ulong *)(piVar2 + 8) != (*(ulong *)(piVar3 + 10) ^ 1) &&
              (local_29 = true, *(ulong *)(piVar2 + 10) != (*(ulong *)(piVar3 + 8) ^ 1))))) {
            local_29 = *(ulong *)(piVar2 + 10) == (*(ulong *)(piVar3 + 10) ^ 1);
          }
          pNode_local._4_4_ = (uint)local_29;
        }
      }
    }
  }
  return pNode_local._4_4_;
}

Assistant:

int Fraig_NodeIsMuxType( Fraig_Node_t * pNode )
{
    Fraig_Node_t * pNode1, * pNode2;

    // make the node regular (it does not matter for EXOR/NEXOR)
    pNode = Fraig_Regular(pNode);
    // if the node or its children are not ANDs or not compl, this cannot be EXOR type
    if ( !Fraig_NodeIsAnd(pNode) )
        return 0;
    if ( !Fraig_NodeIsAnd(pNode->p1) || !Fraig_IsComplement(pNode->p1) )
        return 0;
    if ( !Fraig_NodeIsAnd(pNode->p2) || !Fraig_IsComplement(pNode->p2) )
        return 0;

    // get children
    pNode1 = Fraig_Regular(pNode->p1);
    pNode2 = Fraig_Regular(pNode->p2);
    assert( pNode1->Num < pNode2->Num );

    // compare grandchildren
    // node is an EXOR/NEXOR
    if ( pNode1->p1 == Fraig_Not(pNode2->p1) && pNode1->p2 == Fraig_Not(pNode2->p2) )
        return 1; 

    // otherwise the node is MUX iff it has a pair of equal grandchildren
    return pNode1->p1 == Fraig_Not(pNode2->p1) || 
           pNode1->p1 == Fraig_Not(pNode2->p2) ||
           pNode1->p2 == Fraig_Not(pNode2->p1) ||
           pNode1->p2 == Fraig_Not(pNode2->p2);
}